

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void Catch::cleanUp(void)

{
  undefined8 *puVar1;
  
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub == (long *)0x0) {
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub = (long *)operator_new(0xd8);
    *(anonymous_namespace)::getTheRegistryHub()::theRegistryHub = (long)&PTR__RegistryHub_001a46a8;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[1] = (long)&PTR__RegistryHub_001a46f8
    ;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[2] =
         (long)&PTR__TestRegistry_001a3888;
    *(undefined4 *)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4) = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[5] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[6] =
         (long)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4);
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[7] =
         (long)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 4);
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[8] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[9] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[10] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xb] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xc] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xd] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xe] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0xf] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x10] =
         (long)&PTR__ReporterRegistry_001a4918;
    *(undefined4 *)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12) = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x13] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x14] =
         (long)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12);
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x15] =
         (long)((anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 0x12);
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x16] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x17] =
         (long)&PTR__ExceptionTranslatorRegistry_001a4960;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x1a] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x18] = 0;
    (anonymous_namespace)::getTheRegistryHub()::theRegistryHub[0x19] = 0;
  }
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::getTheRegistryHub()::theRegistryHub + 8))();
  }
  if ((anonymous_namespace)::getTheRegistryHub()::theRegistryHub == (long *)0x0) {
    puVar1 = (undefined8 *)operator_new(0xd8);
    *puVar1 = &PTR__RegistryHub_001a46a8;
    puVar1[1] = &PTR__RegistryHub_001a46f8;
    puVar1[2] = &PTR__TestRegistry_001a3888;
    *(undefined4 *)(puVar1 + 4) = 0;
    puVar1[5] = 0;
    puVar1[6] = puVar1 + 4;
    puVar1[7] = puVar1 + 4;
    puVar1[8] = 0;
    puVar1[9] = 0;
    puVar1[10] = 0;
    puVar1[0xb] = 0;
    puVar1[0xc] = 0;
    puVar1[0xd] = 0;
    puVar1[0xe] = 0;
    puVar1[0xf] = 0;
    puVar1[0x10] = &PTR__ReporterRegistry_001a4918;
    *(undefined4 *)(puVar1 + 0x12) = 0;
    puVar1[0x13] = 0;
    puVar1[0x14] = puVar1 + 0x12;
    puVar1[0x15] = puVar1 + 0x12;
    puVar1[0x16] = 0;
    puVar1[0x17] = &PTR__ExceptionTranslatorRegistry_001a4960;
    puVar1[0x1a] = 0;
    puVar1[0x18] = 0;
    puVar1[0x19] = 0;
  }
  (anonymous_namespace)::getTheRegistryHub()::theRegistryHub = (long *)0x0;
  if ((anonymous_namespace)::currentContext != (long *)0x0) {
    (**(code **)(*(anonymous_namespace)::currentContext + 8))();
  }
  (anonymous_namespace)::currentContext = (long *)0x0;
  return;
}

Assistant:

void cleanUp() {
        delete getTheRegistryHub();
        getTheRegistryHub() = NULL;
        cleanUpContext();
    }